

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_NurbsSurface::Write(ON_NurbsSurface *this,ON_BinaryArchive *file)

{
  int iVar1;
  double *p;
  byte local_76;
  byte local_75;
  int local_74;
  int local_70;
  int local_6c;
  int local_60;
  int local_5c;
  int j;
  int i;
  int cv_size;
  int count;
  ON_BoundingBox bbox;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_NurbsSurface *this_local;
  
  bbox.m_max.z._7_1_ = ON_BinaryArchive::Write3dmChunkVersion(file,1,0);
  if ((bool)bbox.m_max.z._7_1_) {
    if ((bool)bbox.m_max.z._7_1_) {
      bbox.m_max.z._7_1_ = ON_BinaryArchive::WriteInt(file,this->m_dim);
    }
    if ((bool)bbox.m_max.z._7_1_ != false) {
      bbox.m_max.z._7_1_ = ON_BinaryArchive::WriteInt(file,this->m_is_rat);
    }
    if ((bool)bbox.m_max.z._7_1_ != false) {
      bbox.m_max.z._7_1_ = ON_BinaryArchive::WriteInt(file,this->m_order[0]);
    }
    if ((bool)bbox.m_max.z._7_1_ != false) {
      bbox.m_max.z._7_1_ = ON_BinaryArchive::WriteInt(file,this->m_order[1]);
    }
    if ((bool)bbox.m_max.z._7_1_ != false) {
      bbox.m_max.z._7_1_ = ON_BinaryArchive::WriteInt(file,this->m_cv_count[0]);
    }
    if ((bool)bbox.m_max.z._7_1_ != false) {
      bbox.m_max.z._7_1_ = ON_BinaryArchive::WriteInt(file,this->m_cv_count[1]);
    }
    if ((bool)bbox.m_max.z._7_1_ != false) {
      bbox.m_max.z._7_1_ = ON_BinaryArchive::WriteInt(file,0);
    }
    if ((bool)bbox.m_max.z._7_1_ != false) {
      bbox.m_max.z._7_1_ = ON_BinaryArchive::WriteInt(file,0);
    }
    if ((bool)bbox.m_max.z._7_1_ != false) {
      ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)&cv_size);
      bbox.m_max.z._7_1_ = ON_BinaryArchive::WriteBoundingBox(file,(ON_BoundingBox *)&cv_size);
    }
    if (this->m_knot[0] == (double *)0x0) {
      local_6c = 0;
    }
    else {
      local_6c = KnotCount(this,0);
    }
    if ((bbox.m_max.z._7_1_ & 1) != 0) {
      bbox.m_max.z._7_1_ = ON_BinaryArchive::WriteInt(file,local_6c);
    }
    if ((bbox.m_max.z._7_1_ & 1) != 0) {
      bbox.m_max.z._7_1_ = ON_BinaryArchive::WriteDouble(file,(long)local_6c,this->m_knot[0]);
    }
    if (this->m_knot[1] == (double *)0x0) {
      local_70 = 0;
    }
    else {
      local_70 = KnotCount(this,1);
    }
    if ((bbox.m_max.z._7_1_ & 1) != 0) {
      bbox.m_max.z._7_1_ = ON_BinaryArchive::WriteInt(file,local_70);
    }
    if ((bbox.m_max.z._7_1_ & 1) != 0) {
      bbox.m_max.z._7_1_ = ON_BinaryArchive::WriteDouble(file,(long)local_70,this->m_knot[1]);
    }
    iVar1 = CVSize(this);
    if (((((this->m_cv == (double *)0x0) || (iVar1 < 1)) || (this->m_cv_count[0] < 1)) ||
        ((this->m_cv_count[1] < 1 || (this->m_cv_stride[0] < iVar1)))) ||
       (this->m_cv_stride[1] < iVar1)) {
      local_74 = 0;
    }
    else {
      local_74 = this->m_cv_count[0] * this->m_cv_count[1];
    }
    if ((bbox.m_max.z._7_1_ & 1) != 0) {
      bbox.m_max.z._7_1_ = ON_BinaryArchive::WriteInt(file,local_74);
    }
    if (((bbox.m_max.z._7_1_ & 1) != 0) && (0 < local_74)) {
      local_5c = 0;
      while( true ) {
        local_75 = 0;
        if (local_5c < this->m_cv_count[0]) {
          local_75 = bbox.m_max.z._7_1_;
        }
        if ((local_75 & 1) == 0) break;
        local_60 = 0;
        while( true ) {
          local_76 = 0;
          if (local_60 < this->m_cv_count[1]) {
            local_76 = bbox.m_max.z._7_1_;
          }
          if ((local_76 & 1) == 0) break;
          p = CV(this,local_5c,local_60);
          bbox.m_max.z._7_1_ = ON_BinaryArchive::WriteDouble(file,(long)iVar1,p);
          local_60 = local_60 + 1;
        }
        local_5c = local_5c + 1;
      }
    }
  }
  return (bool)(bbox.m_max.z._7_1_ & 1);
}

Assistant:

bool ON_NurbsSurface::Write(
       ON_BinaryArchive&  file // open binary file
     ) const
{
  // NOTE - check legacy I/O code if changed
  bool rc = file.Write3dmChunkVersion(1,0);
  if (rc) {
    if (rc) rc = file.WriteInt( m_dim );
    if (rc) rc = file.WriteInt( m_is_rat );
    if (rc) rc = file.WriteInt( m_order[0] );
    if (rc) rc = file.WriteInt( m_order[1] );
    if (rc) rc = file.WriteInt( m_cv_count[0] );
    if (rc) rc = file.WriteInt( m_cv_count[1] );

    if (rc) rc = file.WriteInt(0); // reserved1
    if (rc) rc = file.WriteInt(0); // reserved2

    if (rc) {
      ON_BoundingBox bbox; // write invalid bounding box - may be used in future
      rc = file.WriteBoundingBox(bbox);
    }
    
    int count = m_knot[0] ? KnotCount(0) : 0;
    if (rc) rc = file.WriteInt(count);
    if (rc) rc = file.WriteDouble( count, m_knot[0] );

    count = m_knot[1] ? KnotCount(1) : 0;
    if (rc) rc = file.WriteInt(count);
    if (rc) rc = file.WriteDouble( count, m_knot[1] );

    const int cv_size = CVSize();
    count = ( m_cv && cv_size > 0
              && m_cv_count[0] > 0 && m_cv_count[1] > 0 
              && m_cv_stride[0] >= cv_size && m_cv_stride[1] >= cv_size) 
          ? m_cv_count[0]*m_cv_count[1]
          : 0;
    if (rc) rc = file.WriteInt(count);
    if (rc && count > 0 ) {
      int i, j;
      for ( i = 0; i < m_cv_count[0] && rc; i++ ) {
        for ( j = 0; j < m_cv_count[1] && rc; j++ ) {
          rc = file.WriteDouble( cv_size, CV(i,j) );
        }
      }
    }
  }
  return rc;
}